

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void fmt::v5::internal::
     convert_arg<unsigned_long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
               (basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                *arg,char type)

{
  uint uVar1;
  ulong uVar2;
  type tVar3;
  
  switch(arg->type_) {
  case int_type:
    uVar1 = (arg->value_).field_0.int_value;
    uVar2 = (ulong)(int)uVar1;
    if ((type != 'i') && (type != 'd')) goto LAB_00133854;
LAB_0013384a:
    tVar3 = long_long_type;
    break;
  case uint_type:
    uVar2 = (ulong)(arg->value_).field_0.uint_value;
    tVar3 = (type == 'd' || type == 'i') + uint_type;
    break;
  case long_long_type:
  case ulong_long_type:
    uVar2 = (arg->value_).field_0.long_long_value;
    tVar3 = (type == 'd' || type == 'i') ^ ulong_long_type;
    break;
  case bool_type:
    if (type == 's') {
      return;
    }
    uVar2 = (ulong)((arg->value_).field_0.int_value != 0);
    tVar3 = long_long_type;
    if (type != 'i') {
      tVar3 = (type != 'd') + 4 + (uint)(type != 'd');
    }
    break;
  case char_type:
    uVar1 = (arg->value_).field_0.uint_value;
    if ((type == 'i') || (type == 'd')) {
      uVar2 = (ulong)(char)uVar1;
      goto LAB_0013384a;
    }
    uVar1 = uVar1 & 0xff;
LAB_00133854:
    uVar2 = (ulong)uVar1;
    tVar3 = uint_type;
    break;
  default:
    goto switchD_001337c1_default;
  }
  *(ulong *)&(arg->value_).field_0 = uVar2;
  arg->type_ = tVar3;
switchD_001337c1_default:
  return;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}